

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O2

void aura_etable_add(aura_export_table *tbl,char *name,char *argfmt,char *retfmt)

{
  long lVar1;
  int iVar2;
  aura_object *paVar3;
  aura_node *paVar4;
  _ENTRY *p_Var5;
  char *pcVar6;
  byte bVar7;
  long lVar8;
  bool bVar9;
  ENTRY __item;
  int arg_valid;
  int ret_valid;
  ENTRY *ep;
  
  arg_valid = 1;
  ret_valid = arg_valid;
  if (tbl->next < tbl->size) {
    paVar3 = aura_etable_find(tbl,name);
    if (paVar3 != (aura_object *)0x0) {
      BUG(tbl->owner,"Internal BUG: Duplicate export table entry: %s",name);
    }
    iVar2 = tbl->next;
    lVar8 = (long)iVar2;
    tbl->next = iVar2 + 1;
    tbl[lVar8 * 3 + 1].size = iVar2;
    if (name == (char *)0x0) {
      paVar4 = tbl->owner;
      pcVar6 = "Internal BUG: object name can\'t be nil";
    }
    else {
      paVar4 = (aura_node *)strdup(name);
      tbl[lVar8 * 3 + 1].owner = paVar4;
      if (argfmt != (char *)0x0) {
        p_Var5 = (_ENTRY *)strdup(argfmt);
        tbl[lVar8 * 3 + 1].index.table = p_Var5;
      }
      if (retfmt != (char *)0x0) {
        pcVar6 = strdup(retfmt);
        *(char **)&tbl[lVar8 * 3 + 1].index.size = pcVar6;
      }
      if (((argfmt == (char *)0x0) || (tbl[lVar8 * 3 + 1].index.table != (_ENTRY *)0x0)) &&
         ((retfmt == (char *)0x0 ||
          (lVar1._0_4_ = tbl[lVar8 * 3 + 1].index.size,
          lVar1._4_4_ = tbl[lVar8 * 3 + 1].index.filled, lVar1 != 0)))) {
        if (argfmt != (char *)0x0) {
          paVar4 = (aura_node *)
                   aura_fmt_pretty_print(argfmt,&arg_valid,(int *)&tbl[lVar8 * 3 + 2].index.size);
          tbl[lVar8 * 3 + 2].owner = paVar4;
        }
        if (retfmt == (char *)0x0) {
          bVar9 = true;
        }
        else {
          p_Var5 = (_ENTRY *)
                   aura_fmt_pretty_print(retfmt,&ret_valid,(int *)&tbl[lVar8 * 3 + 2].index.filled);
          tbl[lVar8 * 3 + 2].index.table = p_Var5;
          bVar9 = ret_valid != 0;
        }
        bVar7 = arg_valid != 0 & bVar9;
        tbl[lVar8 * 3 + 2].size = (uint)bVar7;
        if (bVar7 == 0) {
          slog(0,3,"Object %d (%s) has corrupt export table",(ulong)(uint)tbl[lVar8 * 3 + 1].size,
               tbl[lVar8 * 3 + 1].owner);
        }
        iVar2 = aura_fmt_len(tbl->owner,argfmt);
        tbl[lVar8 * 3 + 3].size = iVar2;
        iVar2 = aura_fmt_len(tbl->owner,retfmt);
        tbl[lVar8 * 3 + 3].next = iVar2;
        __item.data = tbl + lVar8 * 3 + 1;
        __item.key = (char *)tbl[lVar8 * 3 + 1].owner;
        iVar2 = hsearch_r(__item,ENTER,(ENTRY **)&ep,(hsearch_data *)&tbl->index);
        if (iVar2 != 0) {
          return;
        }
        paVar4 = tbl->owner;
        pcVar6 = "Internal BUG: Error adding entry to hash table";
      }
      else {
        paVar4 = tbl->owner;
        pcVar6 = "Internal allocation error";
      }
    }
  }
  else {
    paVar4 = tbl->owner;
    pcVar6 = "Internal BUG: Insufficient export table storage";
  }
  BUG(paVar4,pcVar6);
}

Assistant:

void aura_etable_add(struct aura_export_table * tbl,
		     const char *		name,
		     const char *		argfmt,
		     const char *		retfmt)
{
	int ret;
	ENTRY e, *ep;
	int arg_valid = 1;
	int ret_valid = 1;
	struct aura_object *target;

	if (tbl->next >= tbl->size)
		BUG(tbl->owner, "Internal BUG: Insufficient export table storage");

	target = aura_etable_find(tbl, name);
	if (target != NULL)
		BUG(tbl->owner, "Internal BUG: Duplicate export table entry: %s", name);

	target = &tbl->objects[tbl->next];
	target->id = tbl->next++;
	if (!name)
		BUG(tbl->owner, "Internal BUG: object name can't be nil");
	else
		target->name = strdup(name);

	if (argfmt)
		target->arg_fmt = strdup(argfmt);
	if (retfmt)
		target->ret_fmt = strdup(retfmt);

	if ((argfmt && !target->arg_fmt) ||
	    (retfmt && !target->ret_fmt))
		BUG(tbl->owner, "Internal allocation error");

	if (argfmt)
		target->arg_pprinted = aura_fmt_pretty_print(argfmt, &arg_valid, &target->num_args);

	if (retfmt)
		target->ret_pprinted = aura_fmt_pretty_print(retfmt, &ret_valid, &target->num_rets);

	target->valid = arg_valid && ret_valid;
	if (!target->valid)
		slog(0, SLOG_WARN, "Object %d (%s) has corrupt export table",
		     target->id, target->name);
	/* Calculate the sizes required */
	target->arglen = aura_fmt_len(tbl->owner, argfmt);
	target->retlen = aura_fmt_len(tbl->owner, retfmt);

	/* Add this shit to index */
	e.key = target->name;
	e.data = (char *)target;
	ret = hsearch_r(e, ENTER, &ep, &tbl->index);
	if (!ret)
		BUG(tbl->owner, "Internal BUG: Error adding entry to hash table");
}